

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportInstallFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  undefined8 config_00;
  cmFileSet *headTarget;
  bool bVar2;
  mapped_type *ppcVar3;
  pointer pcVar4;
  string *psVar5;
  cmLocalGenerator *pcVar6;
  cmMakefile *this_00;
  ostream *poVar7;
  string *psVar8;
  size_type sVar9;
  WrapQuotes wrapQuotes;
  undefined1 auVar10 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  string_view str;
  bool local_559;
  bool local_542;
  string_view local_4e8;
  string_view local_4d8;
  char local_4c1;
  cmAlphaNum local_4c0;
  cmAlphaNum local_490;
  string local_460;
  cmAlphaNum local_440;
  cmAlphaNum local_410;
  string local_3e0;
  int local_3bc;
  string local_3b8;
  undefined1 local_398 [8];
  ostringstream e;
  cmMakefile *mf;
  string *type;
  undefined1 local_190 [16];
  string local_180;
  cmAlphaNum local_160;
  cmAlphaNum local_130;
  undefined1 local_100 [8];
  string dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_a0 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_80 [8];
  cmGeneratorExpression ge;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  cmTargetExport *te_local;
  cmFileSet *fileSet_local;
  cmGeneratorTarget *gte_local;
  cmExportInstallFileGenerator *this_local;
  
  te_local = (cmTargetExport *)fileSet;
  fileSet_local = (cmFileSet *)gte;
  gte_local = (cmGeneratorTarget *)this;
  this_local = (cmExportInstallFileGenerator *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&configs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,(cmMakefile *)(fileSet_local->Name)._M_string_length,IncludeEmptyConfig);
  cge._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          )0x0;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_80,(cmListFileBacktrace *)&cge);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
  ppcVar3 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,(key_type *)&te_local);
  cmInstallFileSetGenerator::GetDestination_abi_cxx11_((string *)&__range1,*ppcVar3);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a0,(string *)local_80);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
  config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_60);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&config);
    if (!bVar2) {
LAB_008c7cfb:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4d8," ");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4e8);
      cmJoin(__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_4d8,local_4e8);
      local_3bc = 1;
LAB_008c7d52:
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_a0);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    dest.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    cmAlphaNum::cmAlphaNum(&local_130,"${_IMPORT_PREFIX}/");
    pcVar4 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_a0);
    headTarget = fileSet_local;
    config_00 = dest.field_2._8_8_;
    pcVar6 = (cmLocalGenerator *)(fileSet_local->Name).field_2._M_allocated_capacity;
    std::__cxx11::string::string((string *)&type);
    wrapQuotes = Wrap;
    psVar5 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar4,pcVar6,(string *)config_00,(cmGeneratorTarget *)headTarget,
                        (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                        (string *)&type);
    auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    str._M_len = auVar10._8_8_;
    str._M_str = (char *)0x1;
    local_190 = auVar10;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_180,auVar10._0_8_,str,wrapQuotes);
    cmAlphaNum::cmAlphaNum(&local_160,&local_180);
    cmStrCat<>((string *)local_100,&local_130,&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&type);
    psVar5 = cmFileSet::GetType_abi_cxx11_((cmFileSet *)te_local);
    pcVar4 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)local_a0);
    bVar2 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar4);
    local_542 = false;
    if (bVar2) {
      _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
      bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
               ::cm::operator____s("CXX_MODULES",0xb);
      bVar2 = std::operator==(_Var1,bVar11);
      local_559 = true;
      if (!bVar2) {
        _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                 ::cm::operator____s("CXX_MODULE_HEADER_UNITS",0x17);
        local_559 = std::operator==(_Var1,bVar11);
      }
      local_542 = local_559;
    }
    if (local_542 == false) {
      pcVar4 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)local_a0);
      bVar2 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar4);
      if (bVar2) {
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_60);
        if (sVar9 != 1) {
          cmAlphaNum::cmAlphaNum(&local_410,"\"$<$<CONFIG:");
          cmAlphaNum::cmAlphaNum(&local_440,(string *)dest.field_2._8_8_);
          cmStrCat<char[3],std::__cxx11::string,char[3]>
                    (&local_3e0,&local_410,&local_440,(char (*) [3])">:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (char (*) [3])">\"");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&configs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          local_3bc = 0;
          goto LAB_008c7cac;
        }
      }
      cmAlphaNum::cmAlphaNum(&local_490,'\"');
      cmAlphaNum::cmAlphaNum(&local_4c0,(string *)local_100);
      local_4c1 = '\"';
      cmStrCat<char>(&local_460,&local_490,&local_4c0,&local_4c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      local_3bc = 2;
    }
    else {
      pcVar6 = cmInstallExportGenerator::GetLocalGenerator(this->IEGen);
      this_00 = cmLocalGenerator::GetMakefile(pcVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
      poVar7 = std::operator<<((ostream *)local_398,"The \"");
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)fileSet_local);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      poVar7 = std::operator<<(poVar7,"\" target\'s interface file set \"");
      psVar8 = cmFileSet::GetName_abi_cxx11_((cmFileSet *)te_local);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      poVar7 = std::operator<<(poVar7,"\" of type \"");
      poVar7 = std::operator<<(poVar7,(string *)psVar5);
      std::operator<<(poVar7,
                      "\" contains context-sensitive base file entries which is not supported.");
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_3bc = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    }
LAB_008c7cac:
    std::__cxx11::string::~string((string *)local_100);
    if (local_3bc != 0) {
      if (local_3bc != 2) goto LAB_008c7d52;
      goto LAB_008c7cfb;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  cmGeneratorExpression ge;
  auto cge = ge.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto dest = cmStrCat("${_IMPORT_PREFIX}/",
                         cmOutputConverter::EscapeForCMake(
                           cge->Evaluate(gte->LocalGenerator, config, gte),
                           cmOutputConverter::WrapQuotes::NoWrap));

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (cge->GetHadContextSensitiveCondition() &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    if (cge->GetHadContextSensitiveCondition() && configs.size() != 1) {
      resultVector.push_back(
        cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
    } else {
      resultVector.push_back(cmStrCat('"', dest, '"'));
      break;
    }
  }

  return cmJoin(resultVector, " ");
}